

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentStamp.cpp
# Opt level: O2

bool __thiscall OpenMD::FragmentStamp::addBondStamp(FragmentStamp *this,BondStamp *bond)

{
  BondStamp *local_8;
  
  local_8 = bond;
  std::vector<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>::push_back
            (&this->bondStamps_,&local_8);
  return true;
}

Assistant:

bool FragmentStamp::addBondStamp(BondStamp* bond) {
    bondStamps_.push_back(bond);
    return true;
  }